

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t add_owner_id(archive_match *a,id_array *ids,int64_t id)

{
  int64_t *piVar1;
  ulong uVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  
  uVar5 = ids->size;
  uVar2 = ids->count;
  if (uVar5 <= uVar2 + 1) {
    sVar4 = 8;
    if (uVar5 != 0) {
      sVar4 = uVar5 * 2;
    }
    ids->size = sVar4;
    piVar1 = (int64_t *)realloc(ids->ids,sVar4 << 3);
    if (piVar1 == (int64_t *)0x0) {
      error_nomem(a);
      return L'\xffffffe2';
    }
    ids->ids = piVar1;
    uVar2 = ids->count;
  }
  uVar3 = 1;
  while ((uVar5 = (ulong)(uVar3 - 1), uVar5 < uVar2 && (ids->ids[uVar5] < id))) {
    uVar3 = uVar3 + 1;
  }
  piVar1 = ids->ids;
  if (uVar2 - uVar5 == 0) {
    ids->count = uVar2 + 1;
    piVar1[uVar2] = id;
  }
  else if (piVar1[uVar5] != id) {
    memmove(piVar1 + uVar3,piVar1 + uVar5,(uVar2 - uVar5) * 8);
    ids->ids[uVar5] = id;
    ids->count = ids->count + 1;
  }
  *(byte *)&a->setflag = (byte)a->setflag | 4;
  return L'\0';
}

Assistant:

static int
add_owner_id(struct archive_match *a, struct id_array *ids, int64_t id)
{
	unsigned i;

	if (ids->count + 1 >= ids->size) {
		void *p;

		if (ids->size == 0)
			ids->size = 8;
		else
			ids->size *= 2;
		p = realloc(ids->ids, sizeof(*ids->ids) * ids->size);
		if (p == NULL)
			return (error_nomem(a));
		ids->ids = (int64_t *)p;
	}

	/* Find an insert point. */
	for (i = 0; i < ids->count; i++) {
		if (ids->ids[i] >= id)
			break;
	}

	/* Add oowner id. */
	if (i == ids->count)
		ids->ids[ids->count++] = id;
	else if (ids->ids[i] != id) {
		memmove(&(ids->ids[i+1]), &(ids->ids[i]),
		    (ids->count - i) * sizeof(ids->ids[0]));
		ids->ids[i] = id;
		ids->count++;
	}
	a->setflag |= ID_IS_SET;
	return (ARCHIVE_OK);
}